

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT> *
wasm::WATParser::absheaptype<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
           *__return_storage_ptr__,ParseModuleTypesCtx *ctx,Shareability share)

{
  bool bVar1;
  Lexer *pLVar2;
  HeapTypeT HVar3;
  allocator<char> local_331;
  string local_330;
  Err local_310;
  uintptr_t local_2f0;
  Exactness local_2e8;
  HeapTypeT local_2e0;
  basic_string_view<char,_std::char_traits<char>_> local_2d0;
  uintptr_t local_2c0;
  Exactness local_2b8;
  HeapTypeT local_2b0;
  basic_string_view<char,_std::char_traits<char>_> local_2a0;
  uintptr_t local_290;
  Exactness local_288;
  HeapTypeT local_280;
  basic_string_view<char,_std::char_traits<char>_> local_270;
  uintptr_t local_260;
  Exactness local_258;
  HeapTypeT local_250;
  basic_string_view<char,_std::char_traits<char>_> local_240;
  uintptr_t local_230;
  Exactness local_228;
  HeapTypeT local_220;
  basic_string_view<char,_std::char_traits<char>_> local_210;
  uintptr_t local_200;
  Exactness local_1f8;
  HeapTypeT local_1f0;
  basic_string_view<char,_std::char_traits<char>_> local_1e0;
  uintptr_t local_1d0;
  Exactness local_1c8;
  HeapTypeT local_1c0;
  basic_string_view<char,_std::char_traits<char>_> local_1b0;
  uintptr_t local_1a0;
  Exactness local_198;
  HeapTypeT local_190;
  basic_string_view<char,_std::char_traits<char>_> local_180;
  uintptr_t local_170;
  Exactness local_168;
  HeapTypeT local_160;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  uintptr_t local_140;
  Exactness local_138;
  HeapTypeT local_130;
  basic_string_view<char,_std::char_traits<char>_> local_120;
  uintptr_t local_110;
  Exactness local_108;
  HeapTypeT local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  uintptr_t local_e0;
  Exactness local_d8;
  HeapTypeT local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  uintptr_t local_b0;
  Exactness local_a8;
  HeapTypeT local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  uintptr_t local_80;
  Exactness local_78;
  HeapTypeT local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  uintptr_t local_50;
  Exactness local_48;
  HeapTypeT local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  Shareability local_1c;
  ParseModuleTypesCtx *pPStack_18;
  Shareability share_local;
  ParseModuleTypesCtx *ctx_local;
  
  local_1c = share;
  pPStack_18 = ctx;
  ctx_local = (ParseModuleTypesCtx *)__return_storage_ptr__;
  local_30 = sv("func",4);
  bVar1 = Lexer::takeKeyword(&ctx->in,local_30);
  if (bVar1) {
    HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeFuncType
                      (&pPStack_18->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                       local_1c);
    local_50 = (uintptr_t)HVar3.type.id;
    local_48 = HVar3.exactness;
    local_40.type.id = local_50;
    local_40.exactness = local_48;
    Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>::
    Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
              (__return_storage_ptr__,&local_40);
  }
  else {
    pLVar2 = &pPStack_18->in;
    local_60 = sv("any",3);
    bVar1 = Lexer::takeKeyword(pLVar2,local_60);
    if (bVar1) {
      HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeAnyType
                        (&pPStack_18->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                         local_1c);
      local_80 = (uintptr_t)HVar3.type.id;
      local_78 = HVar3.exactness;
      local_70.type.id = local_80;
      local_70.exactness = local_78;
      Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>::
      Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                (__return_storage_ptr__,&local_70);
    }
    else {
      pLVar2 = &pPStack_18->in;
      local_90 = sv("extern",6);
      bVar1 = Lexer::takeKeyword(pLVar2,local_90);
      if (bVar1) {
        HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeExternType
                          (&pPStack_18->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                           local_1c);
        local_b0 = (uintptr_t)HVar3.type.id;
        local_a8 = HVar3.exactness;
        local_a0.type.id = local_b0;
        local_a0.exactness = local_a8;
        Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>::
        Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                  (__return_storage_ptr__,&local_a0);
      }
      else {
        pLVar2 = &pPStack_18->in;
        local_c0 = sv("eq",2);
        bVar1 = Lexer::takeKeyword(pLVar2,local_c0);
        if (bVar1) {
          HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeEqType
                            (&pPStack_18->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                             local_1c);
          local_e0 = (uintptr_t)HVar3.type.id;
          local_d8 = HVar3.exactness;
          local_d0.type.id = local_e0;
          local_d0.exactness = local_d8;
          Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>::
          Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                    (__return_storage_ptr__,&local_d0);
        }
        else {
          pLVar2 = &pPStack_18->in;
          local_f0 = sv("i31",3);
          bVar1 = Lexer::takeKeyword(pLVar2,local_f0);
          if (bVar1) {
            HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeI31Type
                              (&pPStack_18->
                                super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,local_1c);
            local_110 = (uintptr_t)HVar3.type.id;
            local_108 = HVar3.exactness;
            local_100.type.id = local_110;
            local_100.exactness = local_108;
            Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
            ::
            Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                      (__return_storage_ptr__,&local_100);
          }
          else {
            pLVar2 = &pPStack_18->in;
            local_120 = sv("struct",6);
            bVar1 = Lexer::takeKeyword(pLVar2,local_120);
            if (bVar1) {
              HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeStructType
                                (&pPStack_18->
                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,local_1c
                                );
              local_140 = (uintptr_t)HVar3.type.id;
              local_138 = HVar3.exactness;
              local_130.type.id = local_140;
              local_130.exactness = local_138;
              Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
              ::
              Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                        (__return_storage_ptr__,&local_130);
            }
            else {
              pLVar2 = &pPStack_18->in;
              local_150 = sv("array",5);
              bVar1 = Lexer::takeKeyword(pLVar2,local_150);
              if (bVar1) {
                HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeArrayType
                                  (&pPStack_18->
                                    super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                                   local_1c);
                local_170 = (uintptr_t)HVar3.type.id;
                local_168 = HVar3.exactness;
                local_160.type.id = local_170;
                local_160.exactness = local_168;
                Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                ::
                Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                          (__return_storage_ptr__,&local_160);
              }
              else {
                pLVar2 = &pPStack_18->in;
                local_180 = sv("exn",3);
                bVar1 = Lexer::takeKeyword(pLVar2,local_180);
                if (bVar1) {
                  HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeExnType
                                    (&pPStack_18->
                                      super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                                     local_1c);
                  local_1a0 = (uintptr_t)HVar3.type.id;
                  local_198 = HVar3.exactness;
                  local_190.type.id = local_1a0;
                  local_190.exactness = local_198;
                  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                  ::
                  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                            (__return_storage_ptr__,&local_190);
                }
                else {
                  pLVar2 = &pPStack_18->in;
                  local_1b0 = sv("string",6);
                  bVar1 = Lexer::takeKeyword(pLVar2,local_1b0);
                  if (bVar1) {
                    HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeStringType
                                      (&pPStack_18->
                                        super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                                       local_1c);
                    local_1d0 = (uintptr_t)HVar3.type.id;
                    local_1c8 = HVar3.exactness;
                    local_1c0.type.id = local_1d0;
                    local_1c0.exactness = local_1c8;
                    Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                    ::
                    Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                              (__return_storage_ptr__,&local_1c0);
                  }
                  else {
                    pLVar2 = &pPStack_18->in;
                    local_1e0 = sv("cont",4);
                    bVar1 = Lexer::takeKeyword(pLVar2,local_1e0);
                    if (bVar1) {
                      HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeContType
                                        (&pPStack_18->
                                          super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                                         local_1c);
                      local_200 = (uintptr_t)HVar3.type.id;
                      local_1f8 = HVar3.exactness;
                      local_1f0.type.id = local_200;
                      local_1f0.exactness = local_1f8;
                      Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                      ::
                      Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                (__return_storage_ptr__,&local_1f0);
                    }
                    else {
                      pLVar2 = &pPStack_18->in;
                      local_210 = sv("none",4);
                      bVar1 = Lexer::takeKeyword(pLVar2,local_210);
                      if (bVar1) {
                        HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeNoneType
                                          (&pPStack_18->
                                            super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                           ,local_1c);
                        local_230 = (uintptr_t)HVar3.type.id;
                        local_228 = HVar3.exactness;
                        local_220.type.id = local_230;
                        local_220.exactness = local_228;
                        Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                        ::
                        Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                  (__return_storage_ptr__,&local_220);
                      }
                      else {
                        pLVar2 = &pPStack_18->in;
                        local_240 = sv("noextern",8);
                        bVar1 = Lexer::takeKeyword(pLVar2,local_240);
                        if (bVar1) {
                          HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeNoextType
                                            (&pPStack_18->
                                              super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                             ,local_1c);
                          local_260 = (uintptr_t)HVar3.type.id;
                          local_258 = HVar3.exactness;
                          local_250.type.id = local_260;
                          local_250.exactness = local_258;
                          Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                          ::
                          Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                    (__return_storage_ptr__,&local_250);
                        }
                        else {
                          pLVar2 = &pPStack_18->in;
                          local_270 = sv("nofunc",6);
                          bVar1 = Lexer::takeKeyword(pLVar2,local_270);
                          if (bVar1) {
                            HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::
                                    makeNofuncType(&pPStack_18->
                                                                                                        
                                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                  ,local_1c);
                            local_290 = (uintptr_t)HVar3.type.id;
                            local_288 = HVar3.exactness;
                            local_280.type.id = local_290;
                            local_280.exactness = local_288;
                            Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                            ::
                            Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                      (__return_storage_ptr__,&local_280);
                          }
                          else {
                            pLVar2 = &pPStack_18->in;
                            local_2a0 = sv("noexn",5);
                            bVar1 = Lexer::takeKeyword(pLVar2,local_2a0);
                            if (bVar1) {
                              HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::
                                      makeNoexnType(&pPStack_18->
                                                                                                          
                                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                  ,local_1c);
                              local_2c0 = (uintptr_t)HVar3.type.id;
                              local_2b8 = HVar3.exactness;
                              local_2b0.type.id = local_2c0;
                              local_2b0.exactness = local_2b8;
                              Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                              ::
                              Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                        (__return_storage_ptr__,&local_2b0);
                            }
                            else {
                              pLVar2 = &pPStack_18->in;
                              local_2d0 = sv("nocont",6);
                              bVar1 = Lexer::takeKeyword(pLVar2,local_2d0);
                              if (bVar1) {
                                HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::
                                        makeNocontType(&pPStack_18->
                                                                                                                
                                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                  ,local_1c);
                                local_2f0 = (uintptr_t)HVar3.type.id;
                                local_2e8 = HVar3.exactness;
                                local_2e0.type.id = local_2f0;
                                local_2e0.exactness = local_2e8;
                                Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                ::
                                Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                          (__return_storage_ptr__,&local_2e0);
                              }
                              else {
                                pLVar2 = &pPStack_18->in;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_330,"expected abstract heap type",
                                           &local_331);
                                Lexer::err(&local_310,pLVar2,&local_330);
                                Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                ::Result(__return_storage_ptr__,&local_310);
                                wasm::Err::~Err(&local_310);
                                std::__cxx11::string::~string((string *)&local_330);
                                std::allocator<char>::~allocator(&local_331);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::HeapTypeT> absheaptype(Ctx& ctx, Shareability share) {
  if (ctx.in.takeKeyword("func"sv)) {
    return ctx.makeFuncType(share);
  }
  if (ctx.in.takeKeyword("any"sv)) {
    return ctx.makeAnyType(share);
  }
  if (ctx.in.takeKeyword("extern"sv)) {
    return ctx.makeExternType(share);
  }
  if (ctx.in.takeKeyword("eq"sv)) {
    return ctx.makeEqType(share);
  }
  if (ctx.in.takeKeyword("i31"sv)) {
    return ctx.makeI31Type(share);
  }
  if (ctx.in.takeKeyword("struct"sv)) {
    return ctx.makeStructType(share);
  }
  if (ctx.in.takeKeyword("array"sv)) {
    return ctx.makeArrayType(share);
  }
  if (ctx.in.takeKeyword("exn"sv)) {
    return ctx.makeExnType(share);
  }
  if (ctx.in.takeKeyword("string"sv)) {
    return ctx.makeStringType(share);
  }
  if (ctx.in.takeKeyword("cont"sv)) {
    return ctx.makeContType(share);
  }
  if (ctx.in.takeKeyword("none"sv)) {
    return ctx.makeNoneType(share);
  }
  if (ctx.in.takeKeyword("noextern"sv)) {
    return ctx.makeNoextType(share);
  }
  if (ctx.in.takeKeyword("nofunc"sv)) {
    return ctx.makeNofuncType(share);
  }
  if (ctx.in.takeKeyword("noexn"sv)) {
    return ctx.makeNoexnType(share);
  }
  if (ctx.in.takeKeyword("nocont"sv)) {
    return ctx.makeNocontType(share);
  }
  return ctx.in.err("expected abstract heap type");
}